

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O2

PropertyAttributes
Js::PropertyRecord::DefaultAttributesForPropertyId(PropertyId propertyId,bool __proto__AsDeleted)

{
  PropertyAttributes PVar1;
  undefined3 in_register_00000031;
  
  PVar1 = '\x0e';
  if (CONCAT31(in_register_00000031,__proto__AsDeleted) == 0) {
    PVar1 = '\a';
  }
  if (propertyId != 0x1eb) {
    PVar1 = '\a';
  }
  return PVar1;
}

Assistant:

PropertyAttributes PropertyRecord::DefaultAttributesForPropertyId(PropertyId propertyId, bool __proto__AsDeleted)
    {
        switch (propertyId)
        {
        case PropertyIds::__proto__:
            if (__proto__AsDeleted)
            {
                //
                // If the property name is __proto__, it could be either [[prototype]] or ignored, or become a local
                // property depending on later environment and property value. To maintain enumeration order when it
                // becomes a local property, add the entry as deleted.
                //
                return PropertyDeletedDefaults;
            }
            return PropertyDynamicTypeDefaults;

        default:
            return PropertyDynamicTypeDefaults;
        }
    }